

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O1

string * Assimp::BaseImporter::GetExtension(string *__return_storage_ptr__,string *file)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  size_type sVar5;
  char cVar6;
  
  lVar4 = std::__cxx11::string::rfind((char)file,0x2e);
  if (lVar4 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)file);
    sVar2 = __return_storage_ptr__->_M_string_length;
    if (sVar2 != 0) {
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      sVar5 = 0;
      do {
        cVar1 = pcVar3[sVar5];
        cVar6 = cVar1 + ' ';
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          cVar6 = cVar1;
        }
        pcVar3[sVar5] = cVar6;
        sVar5 = sVar5 + 1;
      } while (sVar2 != sVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BaseImporter::GetExtension( const std::string& file ) {
    std::string::size_type pos = file.find_last_of('.');

    // no file extension at all
    if (pos == std::string::npos) {
        return "";
    }


    // thanks to Andy Maloney for the hint
    std::string ret = file.substr( pos + 1 );
    std::transform( ret.begin(), ret.end(), ret.begin(), ToLower<char>);

    return ret;
}